

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void InputTextReconcileUndoStateAfterUserCallback
               (ImGuiInputTextState *state,char *new_buf_a,int new_length_a)

{
  unsigned_short *puVar1;
  ImGuiContext *pIVar2;
  ImWchar IVar3;
  int iVar4;
  int insert_len_00;
  ImWchar *pIVar5;
  int local_64;
  int i;
  ImWchar *p;
  int delete_len;
  int insert_len;
  int new_last_diff;
  int old_last_diff;
  int first_diff;
  int shorter_length;
  ImWchar *new_buf;
  int new_length;
  int old_length;
  ImWchar *old_buf;
  ImGuiContext *g;
  int new_length_a_local;
  char *new_buf_a_local;
  ImGuiInputTextState *state_local;
  
  pIVar2 = GImGui;
  puVar1 = (state->TextW).Data;
  insert_len = state->CurLenW;
  delete_len = ImTextCountCharsFromUtf8(new_buf_a,new_buf_a + new_length_a);
  ImVector<char>::reserve_discard(&pIVar2->TempBuffer,(delete_len + 1) * 2);
  pIVar5 = (ImWchar *)(pIVar2->TempBuffer).Data;
  ImTextStrFromUtf8(pIVar5,delete_len + 1,new_buf_a,new_buf_a + new_length_a,(char **)0x0);
  iVar4 = ImMin<int>(insert_len,delete_len);
  for (new_last_diff = 0;
      (new_last_diff < iVar4 && (puVar1[new_last_diff] == pIVar5[new_last_diff]));
      new_last_diff = new_last_diff + 1) {
  }
  if ((new_last_diff != insert_len) || (new_last_diff != delete_len)) {
    do {
      insert_len = insert_len + -1;
      delete_len = delete_len + -1;
      if (insert_len < new_last_diff || delete_len < new_last_diff) break;
    } while (puVar1[insert_len] == pIVar5[delete_len]);
    iVar4 = (delete_len - new_last_diff) + 1;
    insert_len_00 = (insert_len - new_last_diff) + 1;
    if (((0 < iVar4) || (0 < insert_len_00)) &&
       (pIVar5 = ImStb::stb_text_createundo
                           (&(state->Stb).undostate,new_last_diff,insert_len_00,iVar4),
       pIVar5 != (ImWchar *)0x0)) {
      for (local_64 = 0; local_64 < insert_len_00; local_64 = local_64 + 1) {
        IVar3 = ImStb::STB_TEXTEDIT_GETCHAR(state,new_last_diff + local_64);
        pIVar5[local_64] = IVar3;
      }
    }
  }
  return;
}

Assistant:

static void InputTextReconcileUndoStateAfterUserCallback(ImGuiInputTextState* state, const char* new_buf_a, int new_length_a)
{
    ImGuiContext& g = *GImGui;
    const ImWchar* old_buf = state->TextW.Data;
    const int old_length = state->CurLenW;
    const int new_length = ImTextCountCharsFromUtf8(new_buf_a, new_buf_a + new_length_a);
    g.TempBuffer.reserve_discard((new_length + 1) * sizeof(ImWchar));
    ImWchar* new_buf = (ImWchar*)(void*)g.TempBuffer.Data;
    ImTextStrFromUtf8(new_buf, new_length + 1, new_buf_a, new_buf_a + new_length_a);

    const int shorter_length = ImMin(old_length, new_length);
    int first_diff;
    for (first_diff = 0; first_diff < shorter_length; first_diff++)
        if (old_buf[first_diff] != new_buf[first_diff])
            break;
    if (first_diff == old_length && first_diff == new_length)
        return;

    int old_last_diff = old_length - 1;
    int new_last_diff = new_length - 1;
    for (; old_last_diff >= first_diff && new_last_diff >= first_diff; old_last_diff--, new_last_diff--)
        if (old_buf[old_last_diff] != new_buf[new_last_diff])
            break;

    const int insert_len = new_last_diff - first_diff + 1;
    const int delete_len = old_last_diff - first_diff + 1;
    if (insert_len > 0 || delete_len > 0)
        if (STB_TEXTEDIT_CHARTYPE* p = stb_text_createundo(&state->Stb.undostate, first_diff, delete_len, insert_len))
            for (int i = 0; i < delete_len; i++)
                p[i] = ImStb::STB_TEXTEDIT_GETCHAR(state, first_diff + i);
}